

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlantUmlGenerator.cpp
# Opt level: O1

void __thiscall PlantUmlGenerator::endState(PlantUmlGenerator *this,ostream *output,string *indent)

{
  ostream *poVar1;
  const_iterator cVar2;
  undefined8 *puVar3;
  undefined8 *extraout_RDX;
  long lVar4;
  char *pcVar5;
  char *pcVar6;
  ScName *in_R8;
  ScName SStack_50;
  
  puVar3 = (undefined8 *)indent->_M_string_length;
  if ((undefined8 *)0x1 < puVar3) {
    indent->_M_string_length = (long)puVar3 - 2U;
    (indent->_M_dataplus)._M_p[(long)puVar3 - 2U] = '\0';
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (output,(indent->_M_dataplus)._M_p,indent->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"}\n",2);
    return;
  }
  pcVar6 = "%s: __pos (which is %zu) > this->size() (which is %zu)";
  pcVar5 = "basic_string::erase";
  std::__throw_out_of_range_fmt("%s: __pos (which is %zu) > this->size() (which is %zu)");
  removeNamespaces(&SStack_50,in_R8);
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(pcVar6 + 0x10),in_R8);
  if (cVar2._M_node == (_Base_ptr)(pcVar6 + 0x18)) {
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)pcVar5,(char *)*extraout_RDX,extraout_RDX[1]);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)*puVar3,puVar3[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," : * ",5);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,SStack_50._M_dataplus._M_p,SStack_50._M_string_length);
    lVar4 = 1;
    pcVar5 = "\n";
  }
  else {
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)pcVar5,(char *)*extraout_RDX,extraout_RDX[1]);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)*puVar3,puVar3[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," : * <b>",8);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,SStack_50._M_dataplus._M_p,SStack_50._M_string_length);
    lVar4 = 5;
    pcVar5 = "</b>\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar5,lVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)SStack_50._M_dataplus._M_p != &SStack_50.field_2) {
    operator_delete(SStack_50._M_dataplus._M_p,SStack_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void PlantUmlGenerator::endState(std::ostream &output, std::string &indent)
{
    indent.erase(indent.size() - 2);
    output << indent << "}\n";
}